

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O0

vorbis_info_floor * floor1_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  int *i;
  long lVar3;
  long lVar4;
  int t;
  vorbis_info_floor1 *info;
  int local_38;
  int rangebits;
  int maxclass;
  int count;
  int k;
  int j;
  codec_setup_info *ci;
  oggpack_buffer *opb_local;
  vorbis_info *vi_local;
  
  pvVar1 = vi->codec_setup;
  rangebits = 0;
  local_38 = -1;
  i = (int *)calloc(1,0x448);
  lVar3 = oggpack_read(opb,5);
  *i = (int)lVar3;
  for (count = 0; count < *i; count = count + 1) {
    lVar3 = oggpack_read(opb,4);
    i[(long)count + 1] = (int)lVar3;
    if (local_38 < i[(long)count + 1]) {
      local_38 = i[(long)count + 1];
    }
  }
  count = 0;
  while( true ) {
    if (local_38 + 1 <= count) {
      lVar3 = oggpack_read(opb,2);
      i[0xd0] = (int)lVar3 + 1;
      lVar3 = oggpack_read(opb,4);
      count = 0;
      maxclass = 0;
      do {
        if (*i <= count) {
          i[0xd1] = 0;
          i[0xd2] = 1 << ((byte)lVar3 & 0x1f);
          return i;
        }
        rangebits = i[(long)i[(long)count + 1] + 0x20] + rangebits;
        for (; maxclass < rangebits; maxclass = maxclass + 1) {
          lVar4 = oggpack_read(opb,(int)lVar3);
          iVar2 = (int)lVar4;
          i[(long)(maxclass + 2) + 0xd1] = iVar2;
          if ((iVar2 < 0) || (1 << ((byte)lVar3 & 0x1f) <= iVar2)) goto LAB_00155d1d;
        }
        count = count + 1;
      } while( true );
    }
    lVar3 = oggpack_read(opb,3);
    i[(long)count + 0x20] = (int)lVar3 + 1;
    lVar3 = oggpack_read(opb,2);
    i[(long)count + 0x30] = (int)lVar3;
    if (i[(long)count + 0x30] < 0) break;
    if (i[(long)count + 0x30] != 0) {
      lVar3 = oggpack_read(opb,8);
      i[(long)count + 0x40] = (int)lVar3;
    }
    if ((i[(long)count + 0x40] < 0) || (*(int *)((long)pvVar1 + 0x24) <= i[(long)count + 0x40]))
    break;
    for (maxclass = 0; maxclass < 1 << ((byte)i[(long)count + 0x30] & 0x1f); maxclass = maxclass + 1
        ) {
      lVar3 = oggpack_read(opb,8);
      i[(long)count * 8 + (long)maxclass + 0x50] = (int)lVar3 + -1;
      if ((i[(long)count * 8 + (long)maxclass + 0x50] < -1) ||
         (*(int *)((long)pvVar1 + 0x24) <= i[(long)count * 8 + (long)maxclass + 0x50]))
      goto LAB_00155d1d;
    }
    count = count + 1;
  }
LAB_00155d1d:
  floor1_free_info(i);
  return (vorbis_info_floor *)0x0;
}

Assistant:

static vorbis_info_floor *floor1_unpack (vorbis_info *vi,oggpack_buffer *opb){
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;
  int j,k,count=0,maxclass=-1,rangebits;

  vorbis_info_floor1 *info=(vorbis_info_floor1 *)_ogg_calloc(1,sizeof(*info));
  /* read partitions */
  info->partitions=oggpack_read(opb,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    info->partitionclass[j]=oggpack_read(opb,4); /* only 0 to 15 legal */
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* read partition classes */
  for(j=0;j<maxclass+1;j++){
    info->class_dim[j]=oggpack_read(opb,3)+1; /* 1 to 8 */
    info->class_subs[j]=oggpack_read(opb,2); /* 0,1,2,3 bits */
    if(info->class_subs[j]<0)
      goto err_out;
    if(info->class_subs[j])info->class_book[j]=oggpack_read(opb,8);
    if(info->class_book[j]<0 || info->class_book[j]>=ci->books)
      goto err_out;
    for(k=0;k<(1<<info->class_subs[j]);k++){
      info->class_subbook[j][k]=oggpack_read(opb,8)-1;
      if(info->class_subbook[j][k]<-1 || info->class_subbook[j][k]>=ci->books)
	goto err_out;
    }
  }

  /* read the post list */
  info->mult=oggpack_read(opb,2)+1;     /* only 1,2,3,4 legal now */ 
  rangebits=oggpack_read(opb,4);

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]]; 
    for(;k<count;k++){
      int t=info->postlist[k+2]=oggpack_read(opb,rangebits);
      if(t<0 || t>=(1<<rangebits))
	goto err_out;
    }
  }
  info->postlist[0]=0;
  info->postlist[1]=1<<rangebits;

  return(info);
  
 err_out:
  floor1_free_info(info);
  return(NULL);
}